

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::SkeletonReader::InitParameters(SkeletonReader *this)

{
  IO *pIVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  _Base_ptr p_Var8;
  undefined8 uVar9;
  long lVar10;
  _Rb_tree_header *p_Var11;
  string value;
  string key;
  string local_f8;
  char *local_d8;
  long local_d0;
  char local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  SkeletonReader *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pIVar1 = (this->super_Engine).m_IO;
  p_Var8 = (pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var11) {
    local_98 = this;
    do {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,*(long *)(p_Var8 + 1),
                 (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
      lVar7 = local_b0;
      puVar3 = local_b8;
      if (local_b0 != 0) {
        lVar10 = 0;
        do {
          iVar4 = tolower((int)(char)puVar3[lVar10]);
          puVar3[lVar10] = (char)iVar4;
          lVar10 = lVar10 + 1;
        } while (lVar7 != lVar10);
      }
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,*(long *)(p_Var8 + 2),
                 (long)&(p_Var8[2]._M_parent)->_M_color + *(long *)(p_Var8 + 2));
      lVar7 = local_d0;
      pcVar2 = local_d8;
      if (local_d0 != 0) {
        lVar10 = 0;
        do {
          iVar4 = tolower((int)pcVar2[lVar10]);
          pcVar2[lVar10] = (char)iVar4;
          lVar10 = lVar10 + 1;
        } while (lVar7 != lVar10);
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_b8);
      pcVar2 = local_d8;
      if (iVar4 == 0) {
        piVar6 = __errno_location();
        iVar4 = *piVar6;
        *piVar6 = 0;
        lVar7 = strtol(pcVar2,(char **)&local_f8,10);
        if (local_f8._M_dataplus._M_p == pcVar2) {
LAB_0048caa7:
          uVar9 = std::__throw_invalid_argument("stoi");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (local_d8 != local_c8) {
            operator_delete(local_d8);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          _Unwind_Resume(uVar9);
        }
        uVar5 = (uint)lVar7;
        if (((int)uVar5 != lVar7) || (*piVar6 == 0x22)) {
          std::__throw_out_of_range("stoi");
          goto LAB_0048caa7;
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        local_98->m_Verbosity = uVar5;
        if (5 < uVar5) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SkeletonReader","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"InitParameters","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Method verbose argument must be an integer in the range [0,5], in call to Open or Engine constructor"
                     ,"");
          helper::Throw<std::invalid_argument>(&local_f8,&local_70,&local_90,&local_50,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var11);
  }
  return;
}

Assistant:

void SkeletonReader::InitParameters()
{
    for (const auto &pair : m_IO.m_Parameters)
    {
        std::string key(pair.first);
        std::transform(key.begin(), key.end(), key.begin(), ::tolower);

        std::string value(pair.second);
        std::transform(value.begin(), value.end(), value.begin(), ::tolower);

        if (key == "verbose")
        {
            m_Verbosity = std::stoi(value);
            if (m_Verbosity < 0 || m_Verbosity > 5)
                helper::Throw<std::invalid_argument>("Engine", "SkeletonReader", "InitParameters",
                                                     "Method verbose argument must be an "
                                                     "integer in the range [0,5], in call to "
                                                     "Open or Engine constructor");
        }
    }
}